

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::SingleVertexArrayOutputTypeGroup::SingleVertexArrayOutputTypeGroup
          (SingleVertexArrayOutputTypeGroup *this,Context *context,InputType type)

{
  InputType type_00;
  string local_60;
  string local_40;
  
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_40,(Array *)(ulong)type,type);
  deqp::gls::Array::inputTypeToString_abi_cxx11_(&local_60,(Array *)(ulong)type,type_00);
  TestCaseGroup::TestCaseGroup
            (&this->super_TestCaseGroup,context,local_40._M_dataplus._M_p,local_60._M_dataplus._M_p)
  ;
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SingleVertexArrayOutputTypeGroup_00c12f58;
  this->m_type = type;
  return;
}

Assistant:

SingleVertexArrayOutputTypeGroup::SingleVertexArrayOutputTypeGroup (Context& context, Array::InputType type)
	: TestCaseGroup	(context, Array::inputTypeToString(type).c_str(), Array::inputTypeToString(type).c_str())
	, m_type		(type)
{
}